

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::Write(ON_NurbsSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *p;
  int i;
  ON__INT32 i_00;
  size_t count;
  ON_BoundingBox bbox;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_dim);
    iVar3 = 0;
    bVar2 = false;
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_is_rat);
      if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_order[0]), bVar1)) &&
          (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_order[1]), bVar1)) &&
         ((bVar1 = ON_BinaryArchive::WriteInt(file,this->m_cv_count[0]), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_cv_count[1]), bVar1)))) {
        bVar2 = false;
        bVar1 = ON_BinaryArchive::WriteInt(file,0);
        if (bVar1) {
          bVar2 = false;
          bVar1 = ON_BinaryArchive::WriteInt(file,0);
          if (bVar1) {
            ON_BoundingBox::ON_BoundingBox(&bbox);
            bVar2 = ON_BinaryArchive::WriteBoundingBox(file,&bbox);
          }
        }
      }
      else {
        bVar2 = false;
      }
    }
    if (this->m_knot[0] != (double *)0x0) {
      iVar3 = KnotCount(this,0);
    }
    iVar4 = 0;
    bVar1 = false;
    if (bVar2 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,iVar3);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteDouble(file,(long)iVar3,this->m_knot[0]);
      }
      else {
        bVar1 = false;
      }
    }
    if (this->m_knot[1] != (double *)0x0) {
      iVar4 = KnotCount(this,1);
    }
    bVar2 = false;
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,iVar4);
      if (bVar1) {
        bVar2 = ON_BinaryArchive::WriteDouble(file,(long)iVar4,this->m_knot[1]);
      }
      else {
        bVar2 = false;
      }
    }
    count = ((long)this->m_dim + 1) - (ulong)(this->m_is_rat == 0);
    i_00 = 0;
    if (((this->m_cv != (double *)0x0) && (iVar3 = (int)count, 0 < iVar3)) &&
       (i_00 = 0, 0 < this->m_cv_count[0])) {
      i_00 = this->m_cv_count[0] * this->m_cv_count[1];
      if (this->m_cv_stride[1] < iVar3) {
        i_00 = 0;
      }
      if (this->m_cv_stride[0] < iVar3) {
        i_00 = 0;
      }
      if (this->m_cv_count[1] < 1) {
        i_00 = 0;
      }
    }
    if (bVar2 == false) {
      bVar2 = false;
    }
    else {
      bVar2 = ON_BinaryArchive::WriteInt(file,i_00);
      if (0 < i_00 && bVar2) {
        iVar3 = 0;
        bVar2 = true;
        while ((iVar3 < this->m_cv_count[0] && (bVar2 != false))) {
          iVar4 = 0;
          while ((iVar4 < this->m_cv_count[1] && (bVar2 != false))) {
            p = CV(this,iVar3,iVar4);
            bVar2 = ON_BinaryArchive::WriteDouble(file,count,p);
            iVar4 = iVar4 + 1;
          }
          iVar3 = iVar3 + 1;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool ON_NurbsSurface::Write(
       ON_BinaryArchive&  file // open binary file
     ) const
{
  // NOTE - check legacy I/O code if changed
  bool rc = file.Write3dmChunkVersion(1,0);
  if (rc) {
    if (rc) rc = file.WriteInt( m_dim );
    if (rc) rc = file.WriteInt( m_is_rat );
    if (rc) rc = file.WriteInt( m_order[0] );
    if (rc) rc = file.WriteInt( m_order[1] );
    if (rc) rc = file.WriteInt( m_cv_count[0] );
    if (rc) rc = file.WriteInt( m_cv_count[1] );

    if (rc) rc = file.WriteInt(0); // reserved1
    if (rc) rc = file.WriteInt(0); // reserved2

    if (rc) {
      ON_BoundingBox bbox; // write invalid bounding box - may be used in future
      rc = file.WriteBoundingBox(bbox);
    }
    
    int count = m_knot[0] ? KnotCount(0) : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc) rc = file.WriteDouble( count, m_knot[0] );

    count = m_knot[1] ? KnotCount(1) : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc) rc = file.WriteDouble( count, m_knot[1] );

    const int cv_size = CVSize();
    count = ( m_cv && cv_size > 0
              && m_cv_count[0] > 0 && m_cv_count[1] > 0 
              && m_cv_stride[0] >= cv_size && m_cv_stride[1] >= cv_size) 
          ? m_cv_count[0]*m_cv_count[1]
          : 0;
    if (rc) rc = file.WriteInt(count);
    if (rc && count > 0 ) {
      int i, j;
      for ( i = 0; i < m_cv_count[0] && rc; i++ ) {
        for ( j = 0; j < m_cv_count[1] && rc; j++ ) {
          rc = file.WriteDouble( cv_size, CV(i,j) );
        }
      }
    }
  }
  return rc;
}